

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kratos_pass.cc
# Opt level: O0

void __thiscall
init_pass(pybind11::module_&)::PyIRVisitor::visit(kratos::Generator__
          (void *this,Generator *generator)

{
  bool bVar1;
  object local_48;
  object o;
  handle local_30;
  function override;
  gil_scoped_acquire gil;
  Generator *generator_local;
  PyIRVisitor *this_local;
  
  pybind11::gil_scoped_acquire::gil_scoped_acquire((gil_scoped_acquire *)&override);
  pybind11::get_override<kratos::IRVisitor>((pybind11 *)&local_30,(IRVisitor *)this,"visit");
  bVar1 = pybind11::handle::operator_cast_to_bool(&local_30);
  if (bVar1) {
    pybind11::detail::object_api<pybind11::handle>::operator()
              ((object_api<pybind11::handle> *)&local_48,(Generator **)&local_30);
    pybind11::detail::cast_safe<void>(&local_48);
    pybind11::object::~object(&local_48);
  }
  pybind11::function::~function((function *)&local_30);
  pybind11::gil_scoped_acquire::~gil_scoped_acquire((gil_scoped_acquire *)&override);
  if (!bVar1) {
    kratos::IRVisitor::visit((IRVisitor *)this,generator);
  }
  return;
}

Assistant:

void visit(Generator *generator) override {
            PYBIND11_OVERLOAD(void, IRVisitor, visit, generator);
        }